

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::SGXMLScanner::resizeElemState(SGXMLScanner *this)

{
  MemoryManager *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  uint *puVar4;
  uint uVar5;
  uint local_2c;
  uint index;
  uint *newElemLoopState;
  uint *newElemState;
  uint newSize;
  SGXMLScanner *this_local;
  uint *puVar3;
  undefined4 extraout_var_00;
  
  uVar5 = this->fElemStateSize << 1;
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,(ulong)uVar5 << 2);
  puVar3 = (uint *)CONCAT44(extraout_var,iVar2);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,(ulong)uVar5 << 2);
  puVar4 = (uint *)CONCAT44(extraout_var_00,iVar2);
  for (local_2c = 0; local_2c < this->fElemStateSize; local_2c = local_2c + 1) {
    puVar3[local_2c] = this->fElemState[local_2c];
    puVar4[local_2c] = this->fElemLoopState[local_2c];
  }
  for (; local_2c < uVar5; local_2c = local_2c + 1) {
    puVar3[local_2c] = 0;
    puVar4[local_2c] = 0;
  }
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fElemState);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fElemLoopState);
  this->fElemState = puVar3;
  this->fElemLoopState = puVar4;
  this->fElemStateSize = uVar5;
  return;
}

Assistant:

void SGXMLScanner::resizeElemState() {

    unsigned int newSize = fElemStateSize * 2;
    unsigned int* newElemState = (unsigned int*) fMemoryManager->allocate
    (
        newSize * sizeof(unsigned int)
    ); //new unsigned int[newSize];
    unsigned int* newElemLoopState = (unsigned int*) fMemoryManager->allocate
    (
        newSize * sizeof(unsigned int)
    ); //new unsigned int[newSize];

    // Copy the existing values
    unsigned int index = 0;
    for (; index < fElemStateSize; index++)
    {
        newElemState[index] = fElemState[index];
        newElemLoopState[index] = fElemLoopState[index];
    }

    for (; index < newSize; index++)
        newElemLoopState[index] = newElemState[index] = 0;

    // Delete the old array and udpate our members
    fMemoryManager->deallocate(fElemState); //delete [] fElemState;
    fMemoryManager->deallocate(fElemLoopState); //delete [] fElemLoopState;
    fElemState = newElemState;
    fElemLoopState = newElemLoopState;
    fElemStateSize = newSize;
}